

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InstrumentPass::AllConstant
          (InstrumentPass *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *ids)

{
  bool bVar1;
  Op opcode;
  int32_t iVar2;
  reference puVar3;
  IRContext *this_00;
  DefUseManager *this_01;
  Instruction *this_02;
  Instruction *id_inst;
  uint *id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ids_local;
  InstrumentPass *this_local;
  
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(ids);
  id = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(ids);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&id);
    if (!bVar1) {
      return true;
    }
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    this_00 = Pass::context(&this->super_Pass);
    this_01 = IRContext::get_def_use_mgr(this_00);
    this_02 = analysis::DefUseManager::GetDef(this_01,*puVar3);
    opcode = Instruction::opcode(this_02);
    iVar2 = spvOpcodeIsConstant(opcode);
    if (iVar2 == 0) break;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  return false;
}

Assistant:

bool InstrumentPass::AllConstant(const std::vector<uint32_t>& ids) {
  for (auto& id : ids) {
    Instruction* id_inst = context()->get_def_use_mgr()->GetDef(id);
    if (!spvOpcodeIsConstant(id_inst->opcode())) return false;
  }
  return true;
}